

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cxx
# Opt level: O2

void read_children(Fl_Type *p,int paste)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  Fl_Class_Type *this;
  undefined4 extraout_var;
  char *pcVar4;
  int local_34;
  
  Fl_Type::current = p;
  local_34 = paste;
LAB_001988e1:
  pcVar3 = read_word(0);
  do {
    if (pcVar3 == (char *)0x0) {
      if (local_34 != 0 || p == (Fl_Type *)0x0) {
        return;
      }
      pcVar3 = "Missing \'}\'";
LAB_00198d86:
      read_error(pcVar3);
      return;
    }
    if ((*pcVar3 == '}') && (pcVar3[1] == '\0')) {
      if (p != (Fl_Type *)0x0) {
        return;
      }
      pcVar3 = "Unexpected \'}\'";
      goto LAB_00198d86;
    }
    iVar1 = strcmp(pcVar3,"Magic:");
    if (iVar1 == 0) {
      read_fdesign();
      return;
    }
    iVar1 = strcmp(pcVar3,"version");
    if (iVar1 == 0) {
      pcVar3 = read_word(0);
      read_version = strtod(pcVar3,(char **)0x0);
      if ((read_version <= 0.0) || (1.03041 < read_version)) {
        pcVar4 = "unknown version \'%s\'";
LAB_00198ce4:
        read_error(pcVar4,pcVar3);
      }
      goto LAB_001988e1;
    }
    if ((p == (Fl_Type *)0x0) && (iVar1 = strcmp(pcVar3,"define_in_struct"), iVar1 == 0)) {
      p = Fl_Type_make("class");
      pcVar3 = read_word(0);
      Fl_Type::name(p,pcVar3);
      local_34 = 1;
      Fl_Type::current = p;
      goto LAB_001988e1;
    }
    iVar1 = strcmp(pcVar3,"do_not_include_H_from_C");
    if (iVar1 == 0) {
      include_H_from_C = 0;
      goto LAB_001988e1;
    }
    iVar1 = strcmp(pcVar3,"use_FL_COMMAND");
    if (iVar1 == 0) {
      use_FL_COMMAND = 1;
      goto LAB_001988e1;
    }
    iVar1 = strcmp(pcVar3,"i18n_type");
    if (iVar1 == 0) {
      pcVar3 = read_word(0);
      i18n_type = atoi(pcVar3);
      goto LAB_001988e1;
    }
    iVar1 = strcmp(pcVar3,"i18n_function");
    if (iVar1 == 0) {
      pcVar3 = read_word(0);
      i18n_function = strdup(pcVar3);
      goto LAB_001988e1;
    }
    iVar1 = strcmp(pcVar3,"i18n_file");
    if (iVar1 == 0) {
      pcVar3 = read_word(0);
      i18n_file = strdup(pcVar3);
      goto LAB_001988e1;
    }
    iVar1 = strcmp(pcVar3,"i18n_set");
    if (iVar1 == 0) {
      pcVar3 = read_word(0);
      i18n_set = strdup(pcVar3);
      goto LAB_001988e1;
    }
    iVar1 = strcmp(pcVar3,"i18n_include");
    if (iVar1 == 0) {
      pcVar3 = read_word(0);
      i18n_include = strdup(pcVar3);
      goto LAB_001988e1;
    }
    iVar2 = strcmp(pcVar3,"header_name");
    iVar1 = header_file_set;
    if (iVar2 == 0) {
      pcVar3 = read_word(0);
      if (iVar1 == 0) {
        header_file_name = strdup(pcVar3);
      }
      goto LAB_001988e1;
    }
    iVar2 = strcmp(pcVar3,"code_name");
    iVar1 = code_file_set;
    if (iVar2 == 0) {
      pcVar3 = read_word(0);
      if (iVar1 == 0) {
        code_file_name = strdup(pcVar3);
      }
      goto LAB_001988e1;
    }
    iVar1 = strcmp(pcVar3,"snap");
    if (((iVar1 == 0) || (iVar1 = strcmp(pcVar3,"gridx"), iVar1 == 0)) ||
       (iVar1 = strcmp(pcVar3,"gridy"), iVar1 == 0)) {
      read_word(0);
      goto LAB_001988e1;
    }
    this = (Fl_Class_Type *)Fl_Type_make(pcVar3);
    if (this == (Fl_Class_Type *)0x0) {
      pcVar4 = "Unknown word \"%s\"";
      goto LAB_00198ce4;
    }
    pcVar3 = read_word(0);
    Fl_Type::name((Fl_Type *)this,pcVar3);
    pcVar3 = read_word(1);
    if (((*pcVar3 != '{') || (pcVar3[1] != '\0')) &&
       (iVar1 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x26])(), iVar1 != 0)) {
      Fl_Class_Type::prefix(this,(this->super_Fl_Type).name_);
      Fl_Type::name((Fl_Type *)this,pcVar3);
      pcVar3 = read_word(1);
    }
    if (*pcVar3 == '{') {
      pcVar4 = "Missing property list for %s\n";
      if (pcVar3[1] == '\0') {
        (this->super_Fl_Type).open_ = '\0';
        while ((pcVar3 = read_word(0), pcVar3 != (char *)0x0 &&
               ((*pcVar3 != '}' || (pcVar3[1] != '\0'))))) {
          (*(this->super_Fl_Type)._vptr_Fl_Type[0xe])();
        }
        iVar1 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x16])();
        if (iVar1 == 0) goto LAB_001988e1;
        pcVar3 = read_word(1);
        if (*pcVar3 == '{') {
          pcVar4 = "Missing child list for %s\n";
          if (pcVar3[1] == '\0') break;
        }
        else {
          pcVar4 = "Missing child list for %s\n";
        }
      }
    }
    else {
      pcVar4 = "Missing property list for %s\n";
    }
    iVar1 = (*(this->super_Fl_Type)._vptr_Fl_Type[4])(this);
    read_error(pcVar4,CONCAT44(extraout_var,iVar1));
  } while( true );
  read_children((Fl_Type *)this,0);
  Fl_Type::current = p;
  goto LAB_001988e1;
}

Assistant:

static void read_children(Fl_Type *p, int paste) {
  Fl_Type::current = p;
  for (;;) {
    const char *c = read_word();
  REUSE_C:
    if (!c) {
      if (p && !paste) read_error("Missing '}'");
      break;
    }

    if (!strcmp(c,"}")) {
      if (!p) read_error("Unexpected '}'");
      break;
    }

    // this is the first word in a .fd file:
    if (!strcmp(c,"Magic:")) {
      read_fdesign();
      return;
    }

    if (!strcmp(c,"version")) {
      c = read_word();
      read_version = strtod(c,0);
      if (read_version<=0 || read_version>double(FL_VERSION+0.00001))
        read_error("unknown version '%s'",c);
      continue;
    }

    // back compatibility with Vincent Penne's original class code:
    if (!p && !strcmp(c,"define_in_struct")) {
      Fl_Type *t = Fl_Type_make("class");
      t->name(read_word());
      Fl_Type::current = p = t;
      paste = 1; // stops "missing }" error
      continue;
    }

    if (!strcmp(c,"do_not_include_H_from_C")) {
      include_H_from_C=0;
      goto CONTINUE;
    }
    if (!strcmp(c,"use_FL_COMMAND")) {
      use_FL_COMMAND=1;
      goto CONTINUE;
    }
    if (!strcmp(c,"i18n_type")) {
      i18n_type = atoi(read_word());
      goto CONTINUE;
    }
    if (!strcmp(c,"i18n_function")) {
      i18n_function = strdup(read_word());
      goto CONTINUE;
    }
    if (!strcmp(c,"i18n_file")) {
      i18n_file = strdup(read_word());
      goto CONTINUE;
    }
    if (!strcmp(c,"i18n_set")) {
      i18n_set = strdup(read_word());
      goto CONTINUE;
    }
    if (!strcmp(c,"i18n_include")) {
      i18n_include = strdup(read_word());
      goto CONTINUE;
    }
    if (!strcmp(c,"i18n_type"))
    {
      i18n_type = atoi(read_word());
      goto CONTINUE;
    }
    if (!strcmp(c,"i18n_type"))
    {
      i18n_type = atoi(read_word());
      goto CONTINUE;
    }
    if (!strcmp(c,"header_name")) {
      if (!header_file_set) header_file_name = strdup(read_word());
      else read_word();
      goto CONTINUE;
    }

    if (!strcmp(c,"code_name")) {
      if (!code_file_set) code_file_name = strdup(read_word());
      else read_word();
      goto CONTINUE;
    }

    if (!strcmp(c, "snap") || !strcmp(c, "gridx") || !strcmp(c, "gridy")) {
      // grid settings are now global
      read_word();
      goto CONTINUE;
    }

    {Fl_Type *t = Fl_Type_make(c);
    if (!t) {
      read_error("Unknown word \"%s\"", c);
      continue;
    }
    t->name(read_word());

    c = read_word(1);
    if (strcmp(c,"{") && t->is_class()) {   // <prefix> <name>
      ((Fl_Class_Type*)t)->prefix(t->name());
      t->name(c);
      c = read_word(1);
    }

    if (strcmp(c,"{")) {
      read_error("Missing property list for %s\n",t->title());
      goto REUSE_C;
    }

    t->open_ = 0;
    for (;;) {
      const char *cc = read_word();
      if (!cc || !strcmp(cc,"}")) break;
      t->read_property(cc);
    }

    if (!t->is_parent()) continue;
    c = read_word(1);
    if (strcmp(c,"{")) {
      read_error("Missing child list for %s\n",t->title());
      goto REUSE_C;
    }
    read_children(t, 0);}
    Fl_Type::current = p;
  CONTINUE:;
  }
}